

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool HasValidProofOfWork(vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers,
                        Params *consensusParams)

{
  CBlockHeader *pCVar1;
  uint256 hash;
  uint256 hash_00;
  uint256 hash_01;
  uint256 hash_02;
  uint256 hash_03;
  uint256 hash_04;
  uint256 hash_05;
  bool bVar2;
  CBlockHeader *pCVar3;
  long lVar4;
  CBlockHeader *pCVar5;
  long lVar6;
  long in_FS_OFFSET;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = (long)pCVar1 - (long)pCVar3;
  lVar4 = (lVar6 >> 4) * -0x3333333333333333 >> 2;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    pCVar5 = pCVar3 + 2;
    do {
      pCVar3 = pCVar5;
      CBlockHeader::GetHash(&local_58,pCVar3 + -2);
      hash.super_base_blob<256U>.m_data._M_elems[8] =
           local_58.super_base_blob<256U>.m_data._M_elems[8];
      hash.super_base_blob<256U>.m_data._M_elems[9] =
           local_58.super_base_blob<256U>.m_data._M_elems[9];
      hash.super_base_blob<256U>.m_data._M_elems[10] =
           local_58.super_base_blob<256U>.m_data._M_elems[10];
      hash.super_base_blob<256U>.m_data._M_elems[0xb] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xb];
      hash.super_base_blob<256U>.m_data._M_elems[0xc] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xc];
      hash.super_base_blob<256U>.m_data._M_elems[0xd] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xd];
      hash.super_base_blob<256U>.m_data._M_elems[0xe] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xe];
      hash.super_base_blob<256U>.m_data._M_elems[0xf] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xf];
      hash.super_base_blob<256U>.m_data._M_elems[0] =
           local_58.super_base_blob<256U>.m_data._M_elems[0];
      hash.super_base_blob<256U>.m_data._M_elems[1] =
           local_58.super_base_blob<256U>.m_data._M_elems[1];
      hash.super_base_blob<256U>.m_data._M_elems[2] =
           local_58.super_base_blob<256U>.m_data._M_elems[2];
      hash.super_base_blob<256U>.m_data._M_elems[3] =
           local_58.super_base_blob<256U>.m_data._M_elems[3];
      hash.super_base_blob<256U>.m_data._M_elems[4] =
           local_58.super_base_blob<256U>.m_data._M_elems[4];
      hash.super_base_blob<256U>.m_data._M_elems[5] =
           local_58.super_base_blob<256U>.m_data._M_elems[5];
      hash.super_base_blob<256U>.m_data._M_elems[6] =
           local_58.super_base_blob<256U>.m_data._M_elems[6];
      hash.super_base_blob<256U>.m_data._M_elems[7] =
           local_58.super_base_blob<256U>.m_data._M_elems[7];
      hash.super_base_blob<256U>.m_data._M_elems[0x10] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x10];
      hash.super_base_blob<256U>.m_data._M_elems[0x11] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x11];
      hash.super_base_blob<256U>.m_data._M_elems[0x12] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x12];
      hash.super_base_blob<256U>.m_data._M_elems[0x13] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x13];
      hash.super_base_blob<256U>.m_data._M_elems[0x14] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x14];
      hash.super_base_blob<256U>.m_data._M_elems[0x15] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x15];
      hash.super_base_blob<256U>.m_data._M_elems[0x16] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x16];
      hash.super_base_blob<256U>.m_data._M_elems[0x17] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x17];
      hash.super_base_blob<256U>.m_data._M_elems[0x18] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x18];
      hash.super_base_blob<256U>.m_data._M_elems[0x19] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x19];
      hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1a];
      hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1b];
      hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1c];
      hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1d];
      hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1e];
      hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1f];
      bVar2 = CheckProofOfWork(hash,pCVar3[-2].nBits,consensusParams);
      pCVar5 = pCVar3 + -2;
      if (!bVar2) goto LAB_00409e3f;
      CBlockHeader::GetHash(&local_58,pCVar3 + -1);
      hash_00.super_base_blob<256U>.m_data._M_elems[8] =
           local_58.super_base_blob<256U>.m_data._M_elems[8];
      hash_00.super_base_blob<256U>.m_data._M_elems[9] =
           local_58.super_base_blob<256U>.m_data._M_elems[9];
      hash_00.super_base_blob<256U>.m_data._M_elems[10] =
           local_58.super_base_blob<256U>.m_data._M_elems[10];
      hash_00.super_base_blob<256U>.m_data._M_elems[0xb] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xb];
      hash_00.super_base_blob<256U>.m_data._M_elems[0xc] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xc];
      hash_00.super_base_blob<256U>.m_data._M_elems[0xd] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xd];
      hash_00.super_base_blob<256U>.m_data._M_elems[0xe] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xe];
      hash_00.super_base_blob<256U>.m_data._M_elems[0xf] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xf];
      hash_00.super_base_blob<256U>.m_data._M_elems[0] =
           local_58.super_base_blob<256U>.m_data._M_elems[0];
      hash_00.super_base_blob<256U>.m_data._M_elems[1] =
           local_58.super_base_blob<256U>.m_data._M_elems[1];
      hash_00.super_base_blob<256U>.m_data._M_elems[2] =
           local_58.super_base_blob<256U>.m_data._M_elems[2];
      hash_00.super_base_blob<256U>.m_data._M_elems[3] =
           local_58.super_base_blob<256U>.m_data._M_elems[3];
      hash_00.super_base_blob<256U>.m_data._M_elems[4] =
           local_58.super_base_blob<256U>.m_data._M_elems[4];
      hash_00.super_base_blob<256U>.m_data._M_elems[5] =
           local_58.super_base_blob<256U>.m_data._M_elems[5];
      hash_00.super_base_blob<256U>.m_data._M_elems[6] =
           local_58.super_base_blob<256U>.m_data._M_elems[6];
      hash_00.super_base_blob<256U>.m_data._M_elems[7] =
           local_58.super_base_blob<256U>.m_data._M_elems[7];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x10] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x10];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x11] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x11];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x12] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x12];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x13] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x13];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x14] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x14];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x15] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x15];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x16] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x16];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x17] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x17];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x18] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x18];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x19] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x19];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x1a] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1a];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x1b] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1b];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x1c] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1c];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x1d] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1d];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x1e] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1e];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x1f] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1f];
      bVar2 = CheckProofOfWork(hash_00,pCVar3[-1].nBits,consensusParams);
      pCVar5 = pCVar3 + -1;
      if (!bVar2) goto LAB_00409e3f;
      CBlockHeader::GetHash(&local_58,pCVar3);
      hash_01.super_base_blob<256U>.m_data._M_elems[8] =
           local_58.super_base_blob<256U>.m_data._M_elems[8];
      hash_01.super_base_blob<256U>.m_data._M_elems[9] =
           local_58.super_base_blob<256U>.m_data._M_elems[9];
      hash_01.super_base_blob<256U>.m_data._M_elems[10] =
           local_58.super_base_blob<256U>.m_data._M_elems[10];
      hash_01.super_base_blob<256U>.m_data._M_elems[0xb] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xb];
      hash_01.super_base_blob<256U>.m_data._M_elems[0xc] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xc];
      hash_01.super_base_blob<256U>.m_data._M_elems[0xd] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xd];
      hash_01.super_base_blob<256U>.m_data._M_elems[0xe] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xe];
      hash_01.super_base_blob<256U>.m_data._M_elems[0xf] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xf];
      hash_01.super_base_blob<256U>.m_data._M_elems[0] =
           local_58.super_base_blob<256U>.m_data._M_elems[0];
      hash_01.super_base_blob<256U>.m_data._M_elems[1] =
           local_58.super_base_blob<256U>.m_data._M_elems[1];
      hash_01.super_base_blob<256U>.m_data._M_elems[2] =
           local_58.super_base_blob<256U>.m_data._M_elems[2];
      hash_01.super_base_blob<256U>.m_data._M_elems[3] =
           local_58.super_base_blob<256U>.m_data._M_elems[3];
      hash_01.super_base_blob<256U>.m_data._M_elems[4] =
           local_58.super_base_blob<256U>.m_data._M_elems[4];
      hash_01.super_base_blob<256U>.m_data._M_elems[5] =
           local_58.super_base_blob<256U>.m_data._M_elems[5];
      hash_01.super_base_blob<256U>.m_data._M_elems[6] =
           local_58.super_base_blob<256U>.m_data._M_elems[6];
      hash_01.super_base_blob<256U>.m_data._M_elems[7] =
           local_58.super_base_blob<256U>.m_data._M_elems[7];
      hash_01.super_base_blob<256U>.m_data._M_elems[0x10] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x10];
      hash_01.super_base_blob<256U>.m_data._M_elems[0x11] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x11];
      hash_01.super_base_blob<256U>.m_data._M_elems[0x12] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x12];
      hash_01.super_base_blob<256U>.m_data._M_elems[0x13] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x13];
      hash_01.super_base_blob<256U>.m_data._M_elems[0x14] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x14];
      hash_01.super_base_blob<256U>.m_data._M_elems[0x15] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x15];
      hash_01.super_base_blob<256U>.m_data._M_elems[0x16] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x16];
      hash_01.super_base_blob<256U>.m_data._M_elems[0x17] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x17];
      hash_01.super_base_blob<256U>.m_data._M_elems[0x18] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x18];
      hash_01.super_base_blob<256U>.m_data._M_elems[0x19] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x19];
      hash_01.super_base_blob<256U>.m_data._M_elems[0x1a] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1a];
      hash_01.super_base_blob<256U>.m_data._M_elems[0x1b] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1b];
      hash_01.super_base_blob<256U>.m_data._M_elems[0x1c] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1c];
      hash_01.super_base_blob<256U>.m_data._M_elems[0x1d] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1d];
      hash_01.super_base_blob<256U>.m_data._M_elems[0x1e] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1e];
      hash_01.super_base_blob<256U>.m_data._M_elems[0x1f] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1f];
      bVar2 = CheckProofOfWork(hash_01,pCVar3->nBits,consensusParams);
      pCVar5 = pCVar3;
      if (!bVar2) goto LAB_00409e3f;
      CBlockHeader::GetHash(&local_58,pCVar3 + 1);
      hash_02.super_base_blob<256U>.m_data._M_elems[8] =
           local_58.super_base_blob<256U>.m_data._M_elems[8];
      hash_02.super_base_blob<256U>.m_data._M_elems[9] =
           local_58.super_base_blob<256U>.m_data._M_elems[9];
      hash_02.super_base_blob<256U>.m_data._M_elems[10] =
           local_58.super_base_blob<256U>.m_data._M_elems[10];
      hash_02.super_base_blob<256U>.m_data._M_elems[0xb] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xb];
      hash_02.super_base_blob<256U>.m_data._M_elems[0xc] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xc];
      hash_02.super_base_blob<256U>.m_data._M_elems[0xd] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xd];
      hash_02.super_base_blob<256U>.m_data._M_elems[0xe] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xe];
      hash_02.super_base_blob<256U>.m_data._M_elems[0xf] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xf];
      hash_02.super_base_blob<256U>.m_data._M_elems[0] =
           local_58.super_base_blob<256U>.m_data._M_elems[0];
      hash_02.super_base_blob<256U>.m_data._M_elems[1] =
           local_58.super_base_blob<256U>.m_data._M_elems[1];
      hash_02.super_base_blob<256U>.m_data._M_elems[2] =
           local_58.super_base_blob<256U>.m_data._M_elems[2];
      hash_02.super_base_blob<256U>.m_data._M_elems[3] =
           local_58.super_base_blob<256U>.m_data._M_elems[3];
      hash_02.super_base_blob<256U>.m_data._M_elems[4] =
           local_58.super_base_blob<256U>.m_data._M_elems[4];
      hash_02.super_base_blob<256U>.m_data._M_elems[5] =
           local_58.super_base_blob<256U>.m_data._M_elems[5];
      hash_02.super_base_blob<256U>.m_data._M_elems[6] =
           local_58.super_base_blob<256U>.m_data._M_elems[6];
      hash_02.super_base_blob<256U>.m_data._M_elems[7] =
           local_58.super_base_blob<256U>.m_data._M_elems[7];
      hash_02.super_base_blob<256U>.m_data._M_elems[0x10] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x10];
      hash_02.super_base_blob<256U>.m_data._M_elems[0x11] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x11];
      hash_02.super_base_blob<256U>.m_data._M_elems[0x12] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x12];
      hash_02.super_base_blob<256U>.m_data._M_elems[0x13] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x13];
      hash_02.super_base_blob<256U>.m_data._M_elems[0x14] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x14];
      hash_02.super_base_blob<256U>.m_data._M_elems[0x15] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x15];
      hash_02.super_base_blob<256U>.m_data._M_elems[0x16] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x16];
      hash_02.super_base_blob<256U>.m_data._M_elems[0x17] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x17];
      hash_02.super_base_blob<256U>.m_data._M_elems[0x18] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x18];
      hash_02.super_base_blob<256U>.m_data._M_elems[0x19] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x19];
      hash_02.super_base_blob<256U>.m_data._M_elems[0x1a] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1a];
      hash_02.super_base_blob<256U>.m_data._M_elems[0x1b] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1b];
      hash_02.super_base_blob<256U>.m_data._M_elems[0x1c] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1c];
      hash_02.super_base_blob<256U>.m_data._M_elems[0x1d] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1d];
      hash_02.super_base_blob<256U>.m_data._M_elems[0x1e] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1e];
      hash_02.super_base_blob<256U>.m_data._M_elems[0x1f] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1f];
      bVar2 = CheckProofOfWork(hash_02,pCVar3[1].nBits,consensusParams);
      pCVar5 = pCVar3 + 1;
      if (!bVar2) goto LAB_00409e3f;
      lVar4 = lVar4 + -1;
      lVar6 = lVar6 + -0x140;
      pCVar5 = pCVar3 + 4;
    } while (1 < lVar4);
    pCVar3 = pCVar3 + 2;
  }
  lVar4 = (lVar6 >> 4) * -0x3333333333333333;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pCVar5 = pCVar1;
      if (lVar4 != 3) goto LAB_00409e3f;
      CBlockHeader::GetHash(&local_58,pCVar3);
      hash_03.super_base_blob<256U>.m_data._M_elems[8] =
           local_58.super_base_blob<256U>.m_data._M_elems[8];
      hash_03.super_base_blob<256U>.m_data._M_elems[9] =
           local_58.super_base_blob<256U>.m_data._M_elems[9];
      hash_03.super_base_blob<256U>.m_data._M_elems[10] =
           local_58.super_base_blob<256U>.m_data._M_elems[10];
      hash_03.super_base_blob<256U>.m_data._M_elems[0xb] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xb];
      hash_03.super_base_blob<256U>.m_data._M_elems[0xc] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xc];
      hash_03.super_base_blob<256U>.m_data._M_elems[0xd] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xd];
      hash_03.super_base_blob<256U>.m_data._M_elems[0xe] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xe];
      hash_03.super_base_blob<256U>.m_data._M_elems[0xf] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xf];
      hash_03.super_base_blob<256U>.m_data._M_elems[0] =
           local_58.super_base_blob<256U>.m_data._M_elems[0];
      hash_03.super_base_blob<256U>.m_data._M_elems[1] =
           local_58.super_base_blob<256U>.m_data._M_elems[1];
      hash_03.super_base_blob<256U>.m_data._M_elems[2] =
           local_58.super_base_blob<256U>.m_data._M_elems[2];
      hash_03.super_base_blob<256U>.m_data._M_elems[3] =
           local_58.super_base_blob<256U>.m_data._M_elems[3];
      hash_03.super_base_blob<256U>.m_data._M_elems[4] =
           local_58.super_base_blob<256U>.m_data._M_elems[4];
      hash_03.super_base_blob<256U>.m_data._M_elems[5] =
           local_58.super_base_blob<256U>.m_data._M_elems[5];
      hash_03.super_base_blob<256U>.m_data._M_elems[6] =
           local_58.super_base_blob<256U>.m_data._M_elems[6];
      hash_03.super_base_blob<256U>.m_data._M_elems[7] =
           local_58.super_base_blob<256U>.m_data._M_elems[7];
      hash_03.super_base_blob<256U>.m_data._M_elems[0x10] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x10];
      hash_03.super_base_blob<256U>.m_data._M_elems[0x11] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x11];
      hash_03.super_base_blob<256U>.m_data._M_elems[0x12] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x12];
      hash_03.super_base_blob<256U>.m_data._M_elems[0x13] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x13];
      hash_03.super_base_blob<256U>.m_data._M_elems[0x14] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x14];
      hash_03.super_base_blob<256U>.m_data._M_elems[0x15] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x15];
      hash_03.super_base_blob<256U>.m_data._M_elems[0x16] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x16];
      hash_03.super_base_blob<256U>.m_data._M_elems[0x17] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x17];
      hash_03.super_base_blob<256U>.m_data._M_elems[0x18] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x18];
      hash_03.super_base_blob<256U>.m_data._M_elems[0x19] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x19];
      hash_03.super_base_blob<256U>.m_data._M_elems[0x1a] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1a];
      hash_03.super_base_blob<256U>.m_data._M_elems[0x1b] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1b];
      hash_03.super_base_blob<256U>.m_data._M_elems[0x1c] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1c];
      hash_03.super_base_blob<256U>.m_data._M_elems[0x1d] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1d];
      hash_03.super_base_blob<256U>.m_data._M_elems[0x1e] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1e];
      hash_03.super_base_blob<256U>.m_data._M_elems[0x1f] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1f];
      bVar2 = CheckProofOfWork(hash_03,pCVar3->nBits,consensusParams);
      pCVar5 = pCVar3;
      if (!bVar2) goto LAB_00409e3f;
      pCVar3 = pCVar3 + 1;
    }
    CBlockHeader::GetHash(&local_58,pCVar3);
    hash_04.super_base_blob<256U>.m_data._M_elems[8] =
         local_58.super_base_blob<256U>.m_data._M_elems[8];
    hash_04.super_base_blob<256U>.m_data._M_elems[9] =
         local_58.super_base_blob<256U>.m_data._M_elems[9];
    hash_04.super_base_blob<256U>.m_data._M_elems[10] =
         local_58.super_base_blob<256U>.m_data._M_elems[10];
    hash_04.super_base_blob<256U>.m_data._M_elems[0xb] =
         local_58.super_base_blob<256U>.m_data._M_elems[0xb];
    hash_04.super_base_blob<256U>.m_data._M_elems[0xc] =
         local_58.super_base_blob<256U>.m_data._M_elems[0xc];
    hash_04.super_base_blob<256U>.m_data._M_elems[0xd] =
         local_58.super_base_blob<256U>.m_data._M_elems[0xd];
    hash_04.super_base_blob<256U>.m_data._M_elems[0xe] =
         local_58.super_base_blob<256U>.m_data._M_elems[0xe];
    hash_04.super_base_blob<256U>.m_data._M_elems[0xf] =
         local_58.super_base_blob<256U>.m_data._M_elems[0xf];
    hash_04.super_base_blob<256U>.m_data._M_elems[0] =
         local_58.super_base_blob<256U>.m_data._M_elems[0];
    hash_04.super_base_blob<256U>.m_data._M_elems[1] =
         local_58.super_base_blob<256U>.m_data._M_elems[1];
    hash_04.super_base_blob<256U>.m_data._M_elems[2] =
         local_58.super_base_blob<256U>.m_data._M_elems[2];
    hash_04.super_base_blob<256U>.m_data._M_elems[3] =
         local_58.super_base_blob<256U>.m_data._M_elems[3];
    hash_04.super_base_blob<256U>.m_data._M_elems[4] =
         local_58.super_base_blob<256U>.m_data._M_elems[4];
    hash_04.super_base_blob<256U>.m_data._M_elems[5] =
         local_58.super_base_blob<256U>.m_data._M_elems[5];
    hash_04.super_base_blob<256U>.m_data._M_elems[6] =
         local_58.super_base_blob<256U>.m_data._M_elems[6];
    hash_04.super_base_blob<256U>.m_data._M_elems[7] =
         local_58.super_base_blob<256U>.m_data._M_elems[7];
    hash_04.super_base_blob<256U>.m_data._M_elems[0x10] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x10];
    hash_04.super_base_blob<256U>.m_data._M_elems[0x11] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x11];
    hash_04.super_base_blob<256U>.m_data._M_elems[0x12] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x12];
    hash_04.super_base_blob<256U>.m_data._M_elems[0x13] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x13];
    hash_04.super_base_blob<256U>.m_data._M_elems[0x14] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x14];
    hash_04.super_base_blob<256U>.m_data._M_elems[0x15] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x15];
    hash_04.super_base_blob<256U>.m_data._M_elems[0x16] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x16];
    hash_04.super_base_blob<256U>.m_data._M_elems[0x17] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x17];
    hash_04.super_base_blob<256U>.m_data._M_elems[0x18] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x18];
    hash_04.super_base_blob<256U>.m_data._M_elems[0x19] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x19];
    hash_04.super_base_blob<256U>.m_data._M_elems[0x1a] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x1a];
    hash_04.super_base_blob<256U>.m_data._M_elems[0x1b] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x1b];
    hash_04.super_base_blob<256U>.m_data._M_elems[0x1c] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x1c];
    hash_04.super_base_blob<256U>.m_data._M_elems[0x1d] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x1d];
    hash_04.super_base_blob<256U>.m_data._M_elems[0x1e] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x1e];
    hash_04.super_base_blob<256U>.m_data._M_elems[0x1f] =
         local_58.super_base_blob<256U>.m_data._M_elems[0x1f];
    bVar2 = CheckProofOfWork(hash_04,pCVar3->nBits,consensusParams);
    pCVar5 = pCVar3;
    if (!bVar2) goto LAB_00409e3f;
    pCVar3 = pCVar3 + 1;
  }
  CBlockHeader::GetHash(&local_58,pCVar3);
  hash_05.super_base_blob<256U>.m_data._M_elems[8] =
       local_58.super_base_blob<256U>.m_data._M_elems[8];
  hash_05.super_base_blob<256U>.m_data._M_elems[9] =
       local_58.super_base_blob<256U>.m_data._M_elems[9];
  hash_05.super_base_blob<256U>.m_data._M_elems[10] =
       local_58.super_base_blob<256U>.m_data._M_elems[10];
  hash_05.super_base_blob<256U>.m_data._M_elems[0xb] =
       local_58.super_base_blob<256U>.m_data._M_elems[0xb];
  hash_05.super_base_blob<256U>.m_data._M_elems[0xc] =
       local_58.super_base_blob<256U>.m_data._M_elems[0xc];
  hash_05.super_base_blob<256U>.m_data._M_elems[0xd] =
       local_58.super_base_blob<256U>.m_data._M_elems[0xd];
  hash_05.super_base_blob<256U>.m_data._M_elems[0xe] =
       local_58.super_base_blob<256U>.m_data._M_elems[0xe];
  hash_05.super_base_blob<256U>.m_data._M_elems[0xf] =
       local_58.super_base_blob<256U>.m_data._M_elems[0xf];
  hash_05.super_base_blob<256U>.m_data._M_elems[0] =
       local_58.super_base_blob<256U>.m_data._M_elems[0];
  hash_05.super_base_blob<256U>.m_data._M_elems[1] =
       local_58.super_base_blob<256U>.m_data._M_elems[1];
  hash_05.super_base_blob<256U>.m_data._M_elems[2] =
       local_58.super_base_blob<256U>.m_data._M_elems[2];
  hash_05.super_base_blob<256U>.m_data._M_elems[3] =
       local_58.super_base_blob<256U>.m_data._M_elems[3];
  hash_05.super_base_blob<256U>.m_data._M_elems[4] =
       local_58.super_base_blob<256U>.m_data._M_elems[4];
  hash_05.super_base_blob<256U>.m_data._M_elems[5] =
       local_58.super_base_blob<256U>.m_data._M_elems[5];
  hash_05.super_base_blob<256U>.m_data._M_elems[6] =
       local_58.super_base_blob<256U>.m_data._M_elems[6];
  hash_05.super_base_blob<256U>.m_data._M_elems[7] =
       local_58.super_base_blob<256U>.m_data._M_elems[7];
  hash_05.super_base_blob<256U>.m_data._M_elems[0x10] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x10];
  hash_05.super_base_blob<256U>.m_data._M_elems[0x11] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x11];
  hash_05.super_base_blob<256U>.m_data._M_elems[0x12] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x12];
  hash_05.super_base_blob<256U>.m_data._M_elems[0x13] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x13];
  hash_05.super_base_blob<256U>.m_data._M_elems[0x14] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x14];
  hash_05.super_base_blob<256U>.m_data._M_elems[0x15] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x15];
  hash_05.super_base_blob<256U>.m_data._M_elems[0x16] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x16];
  hash_05.super_base_blob<256U>.m_data._M_elems[0x17] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x17];
  hash_05.super_base_blob<256U>.m_data._M_elems[0x18] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x18];
  hash_05.super_base_blob<256U>.m_data._M_elems[0x19] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x19];
  hash_05.super_base_blob<256U>.m_data._M_elems[0x1a] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x1a];
  hash_05.super_base_blob<256U>.m_data._M_elems[0x1b] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x1b];
  hash_05.super_base_blob<256U>.m_data._M_elems[0x1c] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x1c];
  hash_05.super_base_blob<256U>.m_data._M_elems[0x1d] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x1d];
  hash_05.super_base_blob<256U>.m_data._M_elems[0x1e] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x1e];
  hash_05.super_base_blob<256U>.m_data._M_elems[0x1f] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x1f];
  bVar2 = CheckProofOfWork(hash_05,pCVar3->nBits,consensusParams);
  pCVar5 = pCVar3;
  if (bVar2) {
    pCVar5 = pCVar1;
  }
LAB_00409e3f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pCVar5 == pCVar1;
}

Assistant:

bool HasValidProofOfWork(const std::vector<CBlockHeader>& headers, const Consensus::Params& consensusParams)
{
    return std::all_of(headers.cbegin(), headers.cend(),
            [&](const auto& header) { return CheckProofOfWork(header.GetHash(), header.nBits, consensusParams);});
}